

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O3

void __thiscall GB::add_n(GB *this)

{
  byte bVar1;
  u16 addr;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  
  if ((this->s).op_tick == 0xe) {
    addr = (this->s).pc;
    (this->s).pc = addr + 1;
    bVar2 = Read(this,addr);
    bVar1 = (this->s).field_2.field_0.a;
    uVar4 = (uint)bVar1 + (uint)bVar2;
    bVar3 = (byte)uVar4;
    (this->s).field_2.field_0.f =
         (byte)(uVar4 >> 4) & 0x10 | (bVar3 == 0) << 7 | (bVar2 ^ bVar1 ^ bVar3) * '\x02' & 0x20;
    (this->s).field_2.field_0.a = bVar3;
    (this->s).op_tick = -2;
  }
  return;
}

Assistant:

void GB::add_n() {
  switch (s.op_tick) {
    case 14: add(read_n()); op_done(); break;
  }
}